

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS ref_cell_degree_with2(REF_CELL ref_cell,REF_INT node0,REF_INT node1,REF_INT *degree)

{
  uint uVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_INT RVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  
  *degree = 0;
  RVar4 = -1;
  uVar6 = 0xffffffff;
  if (-1 < node0) {
    pRVar2 = ref_cell->ref_adj;
    uVar6 = 0xffffffff;
    RVar4 = -1;
    if (node0 < pRVar2->nnode) {
      uVar1 = pRVar2->first[(uint)node0];
      uVar6 = 0xffffffff;
      RVar4 = -1;
      if ((long)(int)uVar1 != -1) {
        RVar4 = pRVar2->item[(int)uVar1].ref;
        uVar6 = (ulong)uVar1;
      }
    }
  }
  iVar5 = 0;
  while( true ) {
    if ((int)uVar6 == -1) break;
    for (lVar7 = 0; (int)lVar7 < ref_cell->node_per; lVar7 = lVar7 + 1) {
      if (ref_cell->c2n[(long)ref_cell->size_per * (long)RVar4 + lVar7] == node1) {
        iVar5 = iVar5 + 1;
        *degree = iVar5;
      }
    }
    pRVar3 = ref_cell->ref_adj->item;
    uVar6 = (ulong)pRVar3[(int)uVar6].next;
    RVar4 = -1;
    if (uVar6 != 0xffffffffffffffff) {
      RVar4 = pRVar3[uVar6].ref;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_degree_with2(REF_CELL ref_cell, REF_INT node0,
                                         REF_INT node1, REF_INT *degree) {
  REF_INT item, cell_node, cell;

  *degree = 0;
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    (*degree)++;
  }

  return REF_SUCCESS;
}